

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEObserver.cpp
# Opt level: O1

void __thiscall CEObserver::copy_members(CEObserver *this,CEObserver *other)

{
  double dVar1;
  
  dVar1 = other->latitude_;
  this->longitude_ = other->longitude_;
  this->latitude_ = dVar1;
  dVar1 = other->pressure_hPa_;
  this->elevation_m_ = other->elevation_m_;
  this->pressure_hPa_ = dVar1;
  this->wavelength_um_ = other->wavelength_um_;
  dVar1 = other->relative_humidity_;
  this->temperature_celsius_ = other->temperature_celsius_;
  this->relative_humidity_ = dVar1;
  this->utc_offset_ = other->utc_offset_;
  this->cache_date_ = other->cache_date_;
  std::vector<double,_std::allocator<double>_>::operator=(&this->pos_cirs_,&other->pos_cirs_);
  std::vector<double,_std::allocator<double>_>::operator=(&this->pos_icrs_,&other->pos_icrs_);
  std::vector<double,_std::allocator<double>_>::operator=(&this->vel_cirs_,&other->vel_cirs_);
  std::vector<double,_std::allocator<double>_>::operator=(&this->vel_icrs_,&other->vel_icrs_);
  return;
}

Assistant:

void CEObserver::copy_members(const CEObserver& other)
{
    longitude_           = other.longitude_;
    latitude_            = other.latitude_;
    elevation_m_         = other.elevation_m_;
    pressure_hPa_        = other.pressure_hPa_;
    temperature_celsius_ = other.temperature_celsius_;
    wavelength_um_       = other.wavelength_um_;
    relative_humidity_   = other.relative_humidity_;
    utc_offset_          = other.utc_offset_;

    // Copy cached parameters
    cache_date_ = other.cache_date_;
    pos_cirs_   = other.pos_cirs_;
    pos_icrs_   = other.pos_icrs_;
    vel_cirs_   = other.vel_cirs_;
    vel_icrs_   = other.vel_icrs_;
}